

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall Memory::LargeHeapBlock::CapturePageHeapFreeStack(LargeHeapBlock *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PageHeapData *pPVar4;
  StackBackTrace *pSVar5;
  
  pPVar4 = this->pageHeapData;
  if ((pPVar4 != (PageHeapData *)0x0) && (pPVar4->pageHeapMode != PageHeapModeOff)) {
    if (pPVar4->pageHeapFreeStack != (StackBackTrace *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x993,"(this->pageHeapData->pageHeapFreeStack == nullptr)",
                         "this->pageHeapData->pageHeapFreeStack == nullptr");
      if (!bVar2) goto LAB_006ea783;
      *puVar3 = 0;
      pPVar4 = this->pageHeapData;
    }
    if (pPVar4->pageHeapAllocStack == (StackBackTrace *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x994,"(this->pageHeapData->pageHeapAllocStack != nullptr)",
                         "this->pageHeapData->pageHeapAllocStack != nullptr");
      if (!bVar2) {
LAB_006ea783:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      pPVar4 = this->pageHeapData;
    }
    if (pPVar4->pageHeapFreeStack != (StackBackTrace *)0x0) {
      StackBackTrace::Capture(pPVar4->pageHeapFreeStack,0);
      return;
    }
    pSVar5 = StackBackTrace::Capture<Memory::NoThrowHeapAllocator>
                       ((NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,0,0x20);
    this->pageHeapData->pageHeapFreeStack = pSVar5;
  }
  return;
}

Assistant:

void
LargeHeapBlock::CapturePageHeapFreeStack()
{
#ifdef STACK_BACK_TRACE
    if (this->InPageHeapMode()) // pageheap can be enabled only for some of the buckets
    {
        // These asserts are true because explicit free is disallowed in
        // page heap mode. If they weren't, we'd have to modify the asserts
        Assert(this->pageHeapData->pageHeapFreeStack == nullptr);
        Assert(this->pageHeapData->pageHeapAllocStack != nullptr);

        if (this->pageHeapData->pageHeapFreeStack != nullptr)
        {
            this->pageHeapData->pageHeapFreeStack->Capture(Recycler::s_numFramesToSkipForPageHeapFree);
        }
        else
        {
            this->pageHeapData->pageHeapFreeStack = StackBackTrace::Capture(&NoThrowHeapAllocator::Instance,
                Recycler::s_numFramesToSkipForPageHeapFree, Recycler::s_numFramesToCaptureForPageHeap);
        }
    }
#endif
}